

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseLU_panel_bmod.h
# Opt level: O2

void __thiscall
Eigen::internal::SparseLUImpl<double,_int>::panel_bmod
          (SparseLUImpl<double,_int> *this,int m,int w,int jcol,int nseg,ScalarVector *dense,
          ScalarVector *tempv,IndexVector *segrep,IndexVector *repfnz,GlobalLU_t *glu)

{
  Matrix<int,__1,_1,_0,__1,_1> *this_00;
  Matrix<int,__1,_1,_0,__1,_1> *this_01;
  Matrix<double,__1,_1,_0,__1,_1> *lusup;
  Scalar SVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int lptr;
  PointerType dataPtr;
  double *pdVar5;
  uint uVar6;
  Matrix<int,__1,_1,_0,__1,_1> *this_02;
  Scalar *pSVar7;
  Scalar *pSVar8;
  ulong uVar9;
  Scalar *pSVar10;
  Scalar *pSVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  ulong nbRows;
  uint uVar15;
  long size;
  long lVar16;
  long index;
  long index_00;
  int iVar17;
  int iVar18;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  Index start;
  int iVar22;
  int iVar23;
  long lVar24;
  ulong row;
  long lVar25;
  undefined1 local_200 [8];
  VectorBlock<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1> repfnz_col_2;
  VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> dense_col_1;
  Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> A;
  undefined1 local_160 [8];
  VectorBlock<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1> repfnz_col;
  long local_128;
  undefined1 auStack_118 [8];
  Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> L;
  undefined1 auStack_e8 [8];
  Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_> U;
  int local_44;
  Scalar local_34 [2];
  int luptr;
  
  size = (long)m;
  lVar16 = (long)jcol;
  local_128 = (long)nseg;
  iVar18 = 0;
  U.m_stride.super_Stride<_1,_0>._8_4_ = 0;
  if (0 < nseg) {
    U.m_stride.super_Stride<_1,_0>._8_4_ = nseg;
  }
  lVar13 = (long)(jcol + w);
  this_00 = &glu->xlsub;
  this_01 = &glu->xlusup;
  lusup = &glu->lusup;
  this_02 = &glu->lsub;
  U.m_stride.super_Stride<_1,_0>._12_4_ = w;
  do {
    if (iVar18 == U.m_stride.super_Stride<_1,_0>._8_4_) {
      return;
    }
    local_128 = local_128 + -1;
    pSVar7 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)segrep,local_128)
    ;
    iVar3 = *pSVar7;
    index = (long)iVar3;
    pSVar7 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&glu->supno,index
                       );
    pSVar7 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)glu,(long)*pSVar7
                       );
    iVar4 = *pSVar7;
    lVar24 = (long)iVar4;
    lVar25 = lVar24 + 1;
    pSVar7 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)this_00,lVar25);
    iVar17 = *pSVar7;
    pSVar7 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)this_00,lVar24);
    iVar23 = *pSVar7;
    pSVar7 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)this_00,lVar24);
    lptr = *pSVar7;
    lVar14 = 0;
    uVar6 = 0;
    iVar22 = 0;
    for (lVar20 = lVar16; lVar20 < lVar13; lVar20 = lVar20 + 1) {
      VectorBlock<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                ((VectorBlock<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1> *)local_160,repfnz,lVar14,
                 size);
      pSVar8 = DenseCoeffsBase<Eigen::Block<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_1>::
               operator()((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>
                           *)local_160,index);
      if (*pSVar8 != -1) {
        uVar12 = (iVar3 + 1) - *pSVar8;
        iVar22 = iVar22 + 1;
        if ((int)uVar6 < (int)uVar12) {
          uVar6 = uVar12;
        }
      }
      lVar14 = lVar14 + size;
    }
    uVar12 = (~(iVar3 - iVar4) + iVar17) - iVar23;
    uVar9 = (ulong)uVar12;
    if (iVar3 - iVar4 < 1) {
      start = 0;
      for (lVar20 = lVar16; lVar20 < lVar13; lVar20 = lVar20 + 1) {
        VectorBlock<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                  ((VectorBlock<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1> *)local_160,repfnz,start,
                   size);
        VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                  ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)auStack_e8,dense,start
                   ,size);
        pSVar8 = DenseCoeffsBase<Eigen::Block<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_1>
                 ::operator()((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>
                               *)local_160,index);
        iVar17 = *pSVar8;
        if (iVar17 != -1) {
          iVar22 = iVar3 - iVar17;
          pSVar7 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)this_01,
                              lVar24);
          local_34[0] = *pSVar7;
          pSVar7 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)this_01,
                              lVar25);
          iVar23 = *pSVar7;
          pSVar7 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)this_01,
                              lVar24);
          iVar23 = iVar23 - *pSVar7;
          iVar17 = iVar17 - iVar4;
          if (iVar22 == 2) {
            LU_kernel_bmod<3>::
            run<Eigen::VectorBlock<Eigen::Matrix<double,_1,1,0,_1,1>,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<int,_1,1,0,_1,1>,int>
                      (3,(VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)auStack_e8,tempv
                       ,lusup,local_34,iVar23,uVar12,this_02,lptr,iVar17);
          }
          else if (iVar22 == 1) {
            LU_kernel_bmod<2>::
            run<Eigen::VectorBlock<Eigen::Matrix<double,_1,1,0,_1,1>,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<int,_1,1,0,_1,1>,int>
                      (2,(VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)auStack_e8,tempv
                       ,lusup,local_34,iVar23,uVar12,this_02,lptr,iVar17);
          }
          else if (iVar22 == 0) {
            LU_kernel_bmod<1>::
            run<Eigen::VectorBlock<Eigen::Matrix<double,_1,1,0,_1,1>,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<int,_1,1,0,_1,1>,int>
                      (1,(VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)auStack_e8,tempv
                       ,lusup,local_34,iVar23,uVar12,this_02,lptr,iVar17);
          }
          else {
            LU_kernel_bmod<-1>::
            run<Eigen::VectorBlock<Eigen::Matrix<double,_1,1,0,_1,1>,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<int,_1,1,0,_1,1>,int>
                      (iVar22 + 1,
                       (VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)auStack_e8,tempv,
                       lusup,local_34,iVar23,uVar12,this_02,lptr,iVar17);
          }
        }
        start = start + size;
      }
    }
    else {
      uVar15 = uVar6 + 1 & 0xfffffffe;
      dataPtr = (tempv->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_data;
      nbRows = (ulong)uVar6;
      OuterStride<-1>::OuterStride((OuterStride<_1> *)local_160,(ulong)uVar15);
      MapBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_Eigen::OuterStride<-1>_>,_0>::
      MapBase((MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>,_0>
               *)auStack_e8,dataPtr,nbRows,(long)iVar22);
      U.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value = (long)local_160;
      local_44 = 0;
      for (lVar20 = lVar16; lVar20 < lVar13; lVar20 = lVar20 + 1) {
        lVar14 = (lVar20 - lVar16) * size;
        VectorBlock<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                  ((VectorBlock<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1> *)local_160,repfnz,lVar14,
                   size);
        VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                  ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)
                   &dense_col_1.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>.
                    super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
                    .m_outerStride,dense,lVar14,size);
        pSVar8 = DenseCoeffsBase<Eigen::Block<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_1>
                 ::operator()((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>
                               *)local_160,index);
        iVar17 = *pSVar8;
        if (iVar17 != -1) {
          pSVar7 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)this_01,
                              lVar24);
          local_34[0] = *pSVar7;
          uVar19 = ~(iVar3 - iVar17) + uVar6;
          uVar21 = 0;
          if (0 < (int)uVar19) {
            uVar21 = (ulong)uVar19;
          }
          for (row = 0; uVar21 != row; row = row + 1) {
            pSVar10 = DenseCoeffsBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_Eigen::OuterStride<-1>_>,_1>
                      ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>,_1>
                                    *)auStack_e8,row,(long)local_44);
            *pSVar10 = 0.0;
          }
          for (lVar14 = 0; lVar14 <= iVar3 - iVar17; lVar14 = lVar14 + 1) {
            pSVar7 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                               ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)this_02,
                                (iVar17 + (lptr - iVar4)) + lVar14);
            pSVar11 = DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_1>
                      ::operator()((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>
                                    *)&dense_col_1.
                                       super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>
                                       .
                                       super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                                       .
                                       super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
                                       .m_outerStride,(long)*pSVar7);
            SVar1 = *pSVar11;
            pSVar10 = DenseCoeffsBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_Eigen::OuterStride<-1>_>,_1>
                      ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>,_1>
                                    *)auStack_e8,(int)uVar19 + lVar14,(long)local_44);
            *pSVar10 = SVar1;
          }
          local_44 = local_44 + 1;
        }
      }
      pSVar7 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)this_01,lVar24)
      ;
      local_34[0] = *pSVar7;
      pSVar7 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)this_01,lVar25)
      ;
      iVar17 = *pSVar7;
      pSVar7 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)this_01,lVar24)
      ;
      lVar20 = (long)iVar17 - (long)*pSVar7;
      lVar25 = (long)(int)(((int)lVar20 + 1) * ((iVar3 + 1) - (uVar6 + iVar4))) + (long)local_34[0];
      local_34[0] = (Scalar)lVar25;
      pdVar5 = (lusup->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
      OuterStride<-1>::OuterStride((OuterStride<_1> *)local_160,lVar20);
      MapBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_0>::
      MapBase((MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
               *)&dense_col_1.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>.
                  super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                  .super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
                  .m_outerStride,pdVar5 + lVar25,nbRows,nbRows);
      L.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_rows = A.
                super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                .m_rows;
      auStack_118 = (undefined1  [8])
                    dense_col_1.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>.
                    super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
                    .m_outerStride;
      L.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_data = A.
                super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                .m_data;
      L.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value = (long)local_160;
      repfnz_col.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
      super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>._16_8_ =
           U.
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>,_0>
           .m_rows.m_value;
      repfnz_col.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
      super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.m_data =
           (PointerType)auStack_e8;
      repfnz_col.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
      super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.m_rows.
      m_value = (long)U.
                      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>,_1>
                      .
                      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>,_0>
                      .m_data;
      repfnz_col.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
      super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.m_xpr =
           (Nested)U.
                   super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>,_1>
                   .
                   super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>,_0>
                   .m_cols.m_value;
      local_160 = (undefined1  [8])auStack_118;
      triangular_solve_retval<1,Eigen::TriangularView<Eigen::Map<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>,5u>,Eigen::Map<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,Eigen::OuterStride<-1>>>
      ::evalTo<Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,Eigen::OuterStride<_1>>>
                ((triangular_solve_retval<1,Eigen::TriangularView<Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>,5u>,Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,Eigen::OuterStride<_1>>>
                  *)local_160,
                 (Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_> *)
                 auStack_e8);
      lVar25 = (long)local_34[0];
      local_34[0] = (Scalar)((int)uVar6 + lVar25);
      pdVar5 = (lusup->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
      OuterStride<-1>::OuterStride((OuterStride<_1> *)auStack_118,lVar20);
      MapBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_0>::
      MapBase((MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
               *)local_160,pdVar5 + (int)uVar6 + lVar25,(long)(int)uVar12,nbRows);
      repfnz_col.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
      super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>._16_8_ =
           auStack_118;
      if ((tempv->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
          <= (long)(int)((uVar15 + uVar12) * U.m_stride.super_Stride<_1,_0>._12_4_ + 1)) {
        __assert_fail("tempv.size()>w*ldu + nrow*w + 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/SparseLU/SparseLU_panel_bmod.h"
                      ,0x91,
                      "void Eigen::internal::SparseLUImpl<double, int>::panel_bmod(const Index, const Index, const Index, const Index, ScalarVector &, ScalarVector &, IndexVector &, IndexVector &, GlobalLU_t &) [Scalar = double, Index = int]"
                     );
      }
      iVar17 = uVar15 * U.m_stride.super_Stride<_1,_0>._12_4_;
      uVar15 = ((local_160._0_4_ << 0x1c) >> 0x1f) + 2;
      if (((ulong)local_160 & 7) != 0) {
        uVar15 = 0;
      }
      uVar19 = uVar15 - 2;
      if (uVar15 < 2) {
        uVar19 = uVar15;
      }
      pdVar5 = (tempv->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
      OuterStride<-1>::OuterStride((OuterStride<_1> *)local_200,(long)(((int)(uVar12 + 1) / 2) * 2))
      ;
      MapBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_0>::
      MapBase((MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
               *)auStack_118,pdVar5 + (long)iVar17 + (long)(int)uVar19,(long)(int)uVar12,
              (long)iVar22);
      L.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value = (long)local_200;
      DenseBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>::
      setZero((DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               *)auStack_118);
      sparselu_gemm<double,long>
                ((long)L.
                       super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                       .
                       super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                       .m_data,
                 L.
                 super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                 .m_rows.m_value,
                 repfnz_col.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
                 super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
                 super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
                 super_MapBase<Eigen::Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
                 super_MapBase<Eigen::Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.
                 m_rows.m_value,(double *)local_160,
                 repfnz_col.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
                 super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
                 super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
                 super_MapBase<Eigen::Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
                 super_MapBase<Eigen::Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.
                 _16_8_,(double *)auStack_e8,
                 U.
                 super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>,_0>
                 .m_cols.m_value,(double *)auStack_118,
                 L.
                 super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                 .m_cols.m_value);
      local_44 = 0;
      if ((int)uVar12 < 1) {
        uVar9 = 0;
      }
      for (lVar25 = lVar16; lVar25 < lVar13; lVar25 = lVar25 + 1) {
        lVar20 = (lVar25 - lVar16) * size;
        VectorBlock<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                  ((VectorBlock<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1> *)local_200,repfnz,lVar20,
                   size);
        VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                  ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)
                   &repfnz_col_2.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
                    super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                    .super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
                    m_outerStride,dense,lVar20,size);
        pSVar8 = DenseCoeffsBase<Eigen::Block<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_1>
                 ::operator()((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>
                               *)local_200,index);
        iVar17 = *pSVar8;
        if (iVar17 != -1) {
          lVar20 = (long)local_44;
          lVar14 = (long)(int)(~(iVar3 - iVar17) + uVar6);
          for (lVar24 = 0; index_00 = (iVar17 + (lptr - iVar4)) + lVar24, lVar24 <= iVar3 - iVar17;
              lVar24 = lVar24 + 1) {
            pSVar7 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                               ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)this_02,
                                index_00);
            SVar1 = *(Scalar *)
                     ((long)auStack_e8 +
                     (U.
                      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>,_1>
                      .
                      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>,_0>
                      .m_cols.m_value * lVar20 + lVar14 + lVar24) * 8);
            pSVar11 = DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_1>
                      ::operator()((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>
                                    *)&repfnz_col_2.
                                       super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>
                                       .
                                       super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                                       .
                                       super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
                                       .m_outerStride,(long)*pSVar7);
            *pSVar11 = SVar1;
            *(double *)
             ((long)auStack_e8 +
             (U.
              super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>,_0>
              .m_cols.m_value * lVar20 + lVar14 + lVar24) * 8) = 0.0;
          }
          for (lVar14 = 0; uVar9 << 3 != lVar14; lVar14 = lVar14 + 8) {
            pSVar7 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                               ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)this_02,
                                index_00);
            dVar2 = *(double *)
                     (lVar14 + (long)(L.
                                      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                                      .
                                      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                      .m_cols.m_value * lVar20 * 8 + (long)auStack_118));
            pSVar11 = DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_1>
                      ::operator()((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>
                                    *)&repfnz_col_2.
                                       super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>
                                       .
                                       super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                                       .
                                       super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
                                       .m_outerStride,(long)*pSVar7);
            *pSVar11 = *pSVar11 - dVar2;
            *(undefined8 *)
             (lVar14 + (long)(L.
                              super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                              .
                              super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                              .m_cols.m_value * lVar20 * 8 + (long)auStack_118)) = 0;
            index_00 = index_00 + 1;
          }
          local_44 = local_44 + 1;
        }
      }
    }
    iVar18 = iVar18 + 1;
  } while( true );
}

Assistant:

void SparseLUImpl<Scalar,Index>::panel_bmod(const Index m, const Index w, const Index jcol, 
                                            const Index nseg, ScalarVector& dense, ScalarVector& tempv,
                                            IndexVector& segrep, IndexVector& repfnz, GlobalLU_t& glu)
{
  
  Index ksub,jj,nextl_col; 
  Index fsupc, nsupc, nsupr, nrow; 
  Index krep, kfnz; 
  Index lptr; // points to the row subscripts of a supernode 
  Index luptr; // ...
  Index segsize,no_zeros ; 
  // For each nonz supernode segment of U[*,j] in topological order
  Index k = nseg - 1; 
  const Index PacketSize = internal::packet_traits<Scalar>::size;
  
  for (ksub = 0; ksub < nseg; ksub++)
  { // For each updating supernode
    /* krep = representative of current k-th supernode
     * fsupc =  first supernodal column
     * nsupc = number of columns in a supernode
     * nsupr = number of rows in a supernode
     */
    krep = segrep(k); k--; 
    fsupc = glu.xsup(glu.supno(krep)); 
    nsupc = krep - fsupc + 1; 
    nsupr = glu.xlsub(fsupc+1) - glu.xlsub(fsupc); 
    nrow = nsupr - nsupc; 
    lptr = glu.xlsub(fsupc); 
    
    // loop over the panel columns to detect the actual number of columns and rows
    Index u_rows = 0;
    Index u_cols = 0;
    for (jj = jcol; jj < jcol + w; jj++)
    {
      nextl_col = (jj-jcol) * m; 
      VectorBlock<IndexVector> repfnz_col(repfnz, nextl_col, m); // First nonzero column index for each row
      
      kfnz = repfnz_col(krep); 
      if ( kfnz == emptyIdxLU ) 
        continue; // skip any zero segment
      
      segsize = krep - kfnz + 1;
      u_cols++;
      u_rows = (std::max)(segsize,u_rows);
    }
    
    if(nsupc >= 2)
    { 
      Index ldu = internal::first_multiple<Index>(u_rows, PacketSize);
      Map<Matrix<Scalar,Dynamic,Dynamic>, Aligned,  OuterStride<> > U(tempv.data(), u_rows, u_cols, OuterStride<>(ldu));
      
      // gather U
      Index u_col = 0;
      for (jj = jcol; jj < jcol + w; jj++)
      {
        nextl_col = (jj-jcol) * m; 
        VectorBlock<IndexVector> repfnz_col(repfnz, nextl_col, m); // First nonzero column index for each row
        VectorBlock<ScalarVector> dense_col(dense, nextl_col, m); // Scatter/gather entire matrix column from/to here
        
        kfnz = repfnz_col(krep); 
        if ( kfnz == emptyIdxLU ) 
          continue; // skip any zero segment
        
        segsize = krep - kfnz + 1;
        luptr = glu.xlusup(fsupc);    
        no_zeros = kfnz - fsupc; 
        
        Index isub = lptr + no_zeros;
        Index off = u_rows-segsize;
        for (Index i = 0; i < off; i++) U(i,u_col) = 0;
        for (Index i = 0; i < segsize; i++)
        {
          Index irow = glu.lsub(isub); 
          U(i+off,u_col) = dense_col(irow); 
          ++isub; 
        }
        u_col++;
      }
      // solve U = A^-1 U
      luptr = glu.xlusup(fsupc);
      Index lda = glu.xlusup(fsupc+1) - glu.xlusup(fsupc);
      no_zeros = (krep - u_rows + 1) - fsupc;
      luptr += lda * no_zeros + no_zeros;
      Map<Matrix<Scalar,Dynamic,Dynamic>, 0, OuterStride<> > A(glu.lusup.data()+luptr, u_rows, u_rows, OuterStride<>(lda) );
      U = A.template triangularView<UnitLower>().solve(U);
      
      // update
      luptr += u_rows;
      Map<Matrix<Scalar,Dynamic,Dynamic>, 0, OuterStride<> > B(glu.lusup.data()+luptr, nrow, u_rows, OuterStride<>(lda) );
      eigen_assert(tempv.size()>w*ldu + nrow*w + 1);
      
      Index ldl = internal::first_multiple<Index>(nrow, PacketSize);
      Index offset = (PacketSize-internal::first_aligned(B.data(), PacketSize)) % PacketSize;
      Map<Matrix<Scalar,Dynamic,Dynamic>, 0, OuterStride<> > L(tempv.data()+w*ldu+offset, nrow, u_cols, OuterStride<>(ldl));
      
      L.setZero();
      internal::sparselu_gemm<Scalar>(L.rows(), L.cols(), B.cols(), B.data(), B.outerStride(), U.data(), U.outerStride(), L.data(), L.outerStride());
      
      // scatter U and L
      u_col = 0;
      for (jj = jcol; jj < jcol + w; jj++)
      {
        nextl_col = (jj-jcol) * m; 
        VectorBlock<IndexVector> repfnz_col(repfnz, nextl_col, m); // First nonzero column index for each row
        VectorBlock<ScalarVector> dense_col(dense, nextl_col, m); // Scatter/gather entire matrix column from/to here
        
        kfnz = repfnz_col(krep); 
        if ( kfnz == emptyIdxLU ) 
          continue; // skip any zero segment
        
        segsize = krep - kfnz + 1;
        no_zeros = kfnz - fsupc; 
        Index isub = lptr + no_zeros;
        
        Index off = u_rows-segsize;
        for (Index i = 0; i < segsize; i++)
        {
          Index irow = glu.lsub(isub++); 
          dense_col(irow) = U.coeff(i+off,u_col);
          U.coeffRef(i+off,u_col) = 0;
        }
        
        // Scatter l into SPA dense[]
        for (Index i = 0; i < nrow; i++)
        {
          Index irow = glu.lsub(isub++); 
          dense_col(irow) -= L.coeff(i,u_col);
          L.coeffRef(i,u_col) = 0;
        }
        u_col++;
      }
    }
    else // level 2 only
    {
      // Sequence through each column in the panel
      for (jj = jcol; jj < jcol + w; jj++)
      {
        nextl_col = (jj-jcol) * m; 
        VectorBlock<IndexVector> repfnz_col(repfnz, nextl_col, m); // First nonzero column index for each row
        VectorBlock<ScalarVector> dense_col(dense, nextl_col, m); // Scatter/gather entire matrix column from/to here
        
        kfnz = repfnz_col(krep); 
        if ( kfnz == emptyIdxLU ) 
          continue; // skip any zero segment
        
        segsize = krep - kfnz + 1;
        luptr = glu.xlusup(fsupc);
        
        Index lda = glu.xlusup(fsupc+1)-glu.xlusup(fsupc);// nsupr
        
        // Perform a trianglar solve and block update, 
        // then scatter the result of sup-col update to dense[]
        no_zeros = kfnz - fsupc; 
              if(segsize==1)  LU_kernel_bmod<1>::run(segsize, dense_col, tempv, glu.lusup, luptr, lda, nrow, glu.lsub, lptr, no_zeros);
        else  if(segsize==2)  LU_kernel_bmod<2>::run(segsize, dense_col, tempv, glu.lusup, luptr, lda, nrow, glu.lsub, lptr, no_zeros);
        else  if(segsize==3)  LU_kernel_bmod<3>::run(segsize, dense_col, tempv, glu.lusup, luptr, lda, nrow, glu.lsub, lptr, no_zeros);
        else                  LU_kernel_bmod<Dynamic>::run(segsize, dense_col, tempv, glu.lusup, luptr, lda, nrow, glu.lsub, lptr, no_zeros); 
      } // End for each column in the panel 
    }
    
  } // End for each updating supernode
}